

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  *(undefined ***)this = &PTR__error_already_set_0011ab58;
  PyErr_Fetch(&this->type,&this->value,&this->trace);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&type, &value, &trace);
    }